

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCMessages.h
# Opt level: O1

void __thiscall gnilk::IPCTestResults::IPCTestResults(IPCTestResults *this,Ref *useTestResult)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_IPCSerializer)._vptr_IPCSerializer = (_func_int **)&PTR__IPCTestResults_00227090;
  (this->super_IPCDeserializer).super_IPCObject._vptr_IPCObject =
       (_func_int **)&PTR__IPCTestResults_002270c8;
  (this->symbolName)._M_dataplus._M_p = (pointer)&(this->symbolName).field_2;
  (this->symbolName)._M_string_length = 0;
  (this->symbolName).field_2._M_local_buf[0] = '\0';
  (this->testResult).super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (useTestResult->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (useTestResult->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->testResult).super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->assertError)._vptr_AssertError = (_func_int **)&PTR__AssertError_00226700;
  (this->assertError).assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->assertError).assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->assertError).assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

IPCTestResults(const trun::TestResult::Ref &useTestResult) : testResult(useTestResult) {}